

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z1_64xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  byte bVar11;
  uint uVar12;
  int iVar13;
  long in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  int in_EDI;
  uint in_R9D;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int mdif;
  int j;
  __m128i res128;
  __m128i a1_128;
  __m128i a0_128;
  __m256i shift;
  int i;
  int base;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i mask128;
  __m128i base_inc128;
  __m128i max_base_x128;
  __m256i c3f;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int local_814;
  undefined8 local_810;
  undefined8 uStack_808;
  int local_7a8;
  int local_758;
  uint local_754;
  byte local_630;
  undefined8 *local_610;
  ulong uStack_4e8;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  
  local_610 = (undefined8 *)CONCAT71(in_register_00000031,in_SIL);
  uVar12 = in_EDI + 0x3f;
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar3 = vpinsrw_avx(auVar2,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar2 = vpinsrw_avx(auVar2,0x10,7);
  uStack_450 = auVar2._0_8_;
  uStack_448 = auVar2._8_8_;
  bVar11 = *(byte *)(in_RCX + (int)uVar12);
  auVar2 = vpinsrb_avx(ZEXT116(bVar11),(uint)bVar11,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,0xe);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar11,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(bVar11),(uint)bVar11,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,0xe);
  auVar1 = vpinsrb_avx(auVar1,(uint)bVar11,0xf);
  local_3a0 = auVar2._0_8_;
  uStack_398 = auVar2._8_8_;
  uStack_390 = auVar1._0_8_;
  uStack_388 = auVar1._8_8_;
  local_630 = (byte)uVar12;
  auVar1 = vpinsrb_avx(ZEXT116(local_630),uVar12 & 0xff,1);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,2);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,3);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,4);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,5);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,6);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,7);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,8);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,9);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,10);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,0xb);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,0xc);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,0xd);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,0xe);
  auVar1 = vpinsrb_avx(auVar1,uVar12 & 0xff,0xf);
  auVar4 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar4 = vpinsrw_avx(auVar4,0x3f,2);
  auVar4 = vpinsrw_avx(auVar4,0x3f,3);
  auVar4 = vpinsrw_avx(auVar4,0x3f,4);
  auVar4 = vpinsrw_avx(auVar4,0x3f,5);
  auVar4 = vpinsrw_avx(auVar4,0x3f,6);
  auVar4 = vpinsrw_avx(auVar4,0x3f,7);
  auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar5 = vpinsrw_avx(auVar5,0x3f,2);
  auVar5 = vpinsrw_avx(auVar5,0x3f,3);
  auVar5 = vpinsrw_avx(auVar5,0x3f,4);
  auVar5 = vpinsrw_avx(auVar5,0x3f,5);
  auVar5 = vpinsrw_avx(auVar5,0x3f,6);
  auVar5 = vpinsrw_avx(auVar5,0x3f,7);
  auVar14 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_410 = auVar14._0_8_;
  uStack_408 = auVar14._8_8_;
  local_758 = 0;
  local_754 = in_R9D;
  while( true ) {
    if (in_EDI <= local_758) {
      return;
    }
    iVar13 = (int)local_754 >> 6;
    if ((int)uVar12 <= iVar13) break;
    auVar14 = vpinsrw_avx(ZEXT216((ushort)local_754),local_754 & 0xffff,1);
    auVar14 = vpinsrw_avx(auVar14,local_754 & 0xffff,2);
    auVar14 = vpinsrw_avx(auVar14,local_754 & 0xffff,3);
    auVar14 = vpinsrw_avx(auVar14,local_754 & 0xffff,4);
    auVar14 = vpinsrw_avx(auVar14,local_754 & 0xffff,5);
    auVar14 = vpinsrw_avx(auVar14,local_754 & 0xffff,6);
    auVar14 = vpinsrw_avx(auVar14,local_754 & 0xffff,7);
    auVar6 = vpinsrw_avx(ZEXT216((ushort)local_754),local_754 & 0xffff,1);
    auVar6 = vpinsrw_avx(auVar6,local_754 & 0xffff,2);
    auVar6 = vpinsrw_avx(auVar6,local_754 & 0xffff,3);
    auVar6 = vpinsrw_avx(auVar6,local_754 & 0xffff,4);
    auVar6 = vpinsrw_avx(auVar6,local_754 & 0xffff,5);
    auVar6 = vpinsrw_avx(auVar6,local_754 & 0xffff,6);
    auVar6 = vpinsrw_avx(auVar6,local_754 & 0xffff,7);
    auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
    uStack_3d0 = auVar15._0_8_;
    uStack_3c8 = auVar15._8_8_;
    auVar8._16_8_ = uStack_3d0;
    auVar8._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar6;
    auVar8._24_8_ = uStack_3c8;
    auVar7._16_8_ = uStack_410;
    auVar7._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar7._24_8_ = uStack_408;
    auVar7 = vpand_avx2(auVar8,auVar7);
    auVar7 = vpsrlw_avx2(auVar7,ZEXT416(1));
    for (local_814 = 0; local_814 < 0x40; local_814 = local_814 + 0x10) {
      if ((int)(uVar12 - (iVar13 + local_814)) < 1) {
        *(undefined8 *)((long)local_610 + (long)local_814) = local_3a0;
        ((undefined8 *)((long)local_610 + (long)local_814))[1] = uStack_398;
      }
      else {
        auVar8 = vpmovzxbw_avx2(*(undefined1 (*) [16])(in_RCX + iVar13 + (long)local_814));
        auVar9 = vpmovzxbw_avx2(*(undefined1 (*) [16])((long)local_814 + 1 + in_RCX + iVar13));
        auVar9 = vpsubw_avx2(auVar9,auVar8);
        auVar8 = vpsllw_avx2(auVar8,ZEXT416(5));
        auVar10._16_8_ = uStack_450;
        auVar10._0_16_ = auVar3;
        auVar10._24_8_ = uStack_448;
        auVar8 = vpaddw_avx2(auVar8,auVar10);
        auVar9 = vpmullw_avx2(auVar9,auVar7);
        auVar8 = vpaddw_avx2(auVar8,auVar9);
        auVar8 = vpsrlw_avx2(auVar8,ZEXT416(5));
        auVar9._16_16_ = ZEXT416(5);
        auVar9._0_16_ = auVar8._16_16_;
        auVar8 = vpackuswb_avx2(auVar8,auVar9);
        bVar11 = (char)iVar13 + (char)local_814;
        auVar14 = vpinsrb_avx(ZEXT116(bVar11),(uint)(byte)(bVar11 + 1),1);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 2),2);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 3),3);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 4),4);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 5),5);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 6),6);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 7),7);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 8),8);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 9),9);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 10),10);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 0xb),0xb);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 0xc),0xc);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 0xd),0xd);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 0xe),0xe);
        auVar14 = vpinsrb_avx(auVar14,(uint)(byte)(bVar11 + 0xf),0xf);
        auVar14 = vpsubusb_avx(auVar1,auVar14);
        uStack_4e8 = SUB168(ZEXT816(0),4);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uStack_4e8;
        auVar14 = vpcmpgtb_avx(auVar14,auVar6 << 0x40);
        auVar14 = vpblendvb_avx(auVar2,auVar8._0_16_,auVar14);
        local_810 = auVar14._0_8_;
        uStack_808 = auVar14._8_8_;
        *(undefined8 *)((long)local_610 + (long)local_814) = local_810;
        ((undefined8 *)((long)local_610 + (long)local_814))[1] = uStack_808;
      }
    }
    local_754 = in_R9D + local_754;
    local_758 = local_758 + 1;
    local_610 = (undefined8 *)(CONCAT71(in_register_00000011,in_DL) + (long)local_610);
  }
  for (local_7a8 = local_758; local_7a8 < in_EDI; local_7a8 = local_7a8 + 1) {
    *local_610 = local_3a0;
    local_610[1] = uStack_398;
    local_610[2] = uStack_390;
    local_610[3] = uStack_388;
    local_610[4] = local_3a0;
    local_610[5] = uStack_398;
    local_610[6] = uStack_390;
    local_610[7] = uStack_388;
    local_610 = (undefined8 *)(CONCAT71(in_register_00000011,in_DL) + (long)local_610);
  }
  return;
}

Assistant:

static void dr_prediction_z1_64xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *above, int upsample_above,
                                       int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a1, a32, a16;
  __m256i a_mbase_x, diff, c3f;
  __m128i max_base_x128, base_inc128, mask128;

  a16 = _mm256_set1_epi16(16);
  a_mbase_x = _mm256_set1_epi8((int8_t)above[max_base_x]);
  max_base_x128 = _mm_set1_epi8(max_base_x);
  c3f = _mm256_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res;
    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift =
        _mm256_srli_epi16(_mm256_and_si256(_mm256_set1_epi16(x), c3f), 1);

    __m128i a0_128, a1_128, res128;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm_storeu_si128((__m128i *)(dst + j),
                         _mm256_castsi256_si128(a_mbase_x));
      } else {
        a0_128 = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_128 = _mm_loadu_si128((__m128i *)(above + base + 1 + j));
        a0 = _mm256_cvtepu8_epi16(a0_128);
        a1 = _mm256_cvtepu8_epi16(a1_128);

        diff = _mm256_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi16(diff, shift);

        res = _mm256_add_epi16(a32, b);
        res = _mm256_srli_epi16(res, 5);
        res = _mm256_packus_epi16(
            res, _mm256_castsi128_si256(
                     _mm256_extracti128_si256(res, 1)));  // 16 8bit values

        base_inc128 =
            _mm_setr_epi8((int8_t)(base + j), (int8_t)(base + j + 1),
                          (int8_t)(base + j + 2), (int8_t)(base + j + 3),
                          (int8_t)(base + j + 4), (int8_t)(base + j + 5),
                          (int8_t)(base + j + 6), (int8_t)(base + j + 7),
                          (int8_t)(base + j + 8), (int8_t)(base + j + 9),
                          (int8_t)(base + j + 10), (int8_t)(base + j + 11),
                          (int8_t)(base + j + 12), (int8_t)(base + j + 13),
                          (int8_t)(base + j + 14), (int8_t)(base + j + 15));

        mask128 = _mm_cmpgt_epi8(_mm_subs_epu8(max_base_x128, base_inc128),
                                 _mm_setzero_si128());
        res128 = _mm_blendv_epi8(_mm256_castsi256_si128(a_mbase_x),
                                 _mm256_castsi256_si128(res), mask128);
        _mm_storeu_si128((__m128i *)(dst + j), res128);
      }
    }
    x += dx;
  }
}